

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O3

bool __thiscall
draco::MeshAttributeCornerTable::InitFromAttribute
          (MeshAttributeCornerTable *this,Mesh *mesh,CornerTable *table,PointAttribute *att)

{
  ulong *puVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pIVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar12;
  uint uVar13;
  bool bVar14;
  _Bit_type *p_Var15;
  CornerTable *this_00;
  uint uVar16;
  uint uVar17;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar18;
  int iVar19;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar20;
  ulong uVar21;
  ulong uVar22;
  
  bVar9 = InitEmpty(this,table);
  if (bVar9) {
    piVar2 = (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_32_bit_.vector_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
         = (pointer)0x0;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)piVar3 - (long)piVar2);
    }
    pcVar4 = (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->valence_cache_).vertex_valence_cache_8_bit_.vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pcVar4 != (pointer)0x0) {
      operator_delete(pcVar4,(long)pcVar5 - (long)pcVar4);
    }
    this_00 = this->corner_table_;
    if ((int)((ulong)((long)(this_00->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_00->corner_to_vertex_map_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) != 0) {
      uVar22 = 0;
      do {
        uVar13 = (uint)uVar22;
        bVar10 = CornerTable::IsDegenerated(this_00,(FaceIndex)(uint)((uVar22 & 0xffffffff) / 3));
        this_00 = this->corner_table_;
        if (!bVar10) {
          uVar11 = (this_00->opposite_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar22].value_;
          if ((ulong)uVar11 == 0xffffffff) {
            puVar1 = (ulong *)((long)(this->is_edge_on_seam_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + (uVar22 >> 6 & 0x3ffffff) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)uVar22 & 0x3f);
            uVar11 = uVar13 - 2;
            if (0x55555555 < (uVar13 + 1) * -0x55555555) {
              uVar11 = uVar13 + 1;
            }
            IVar12.value_ = 0xffffffff;
            if (uVar11 != 0xffffffff) {
              IVar12.value_ =
                   (this_00->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
            }
            p_Var15 = (this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            p_Var15[IVar12.value_ >> 6] =
                 p_Var15[IVar12.value_ >> 6] | 1L << ((byte)IVar12.value_ & 0x3f);
            uVar11 = uVar13;
            if (uVar13 * -0x55555555 < 0x55555556) {
LAB_0013375e:
              uVar11 = uVar11 + 2;
              IVar12.value_ = 0xffffffff;
              if (uVar11 != 0xffffffff) goto LAB_00133768;
            }
            else {
              uVar11 = uVar13 - 1;
LAB_00133768:
              IVar12.value_ =
                   (this_00->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
            }
            p_Var15[IVar12.value_ >> 6] =
                 p_Var15[IVar12.value_ >> 6] | 1L << ((byte)IVar12.value_ & 0x3f);
          }
          else if (uVar22 <= uVar11) {
            uVar21 = uVar22 & 0xffffffff;
            uVar17 = uVar11;
            bVar10 = true;
            do {
              bVar14 = bVar10;
              uVar16 = 0xffffffff;
              iVar19 = (int)uVar21;
              if ((iVar19 != -1) && (uVar16 = iVar19 + 1, uVar16 * -0x55555555 < 0x55555556)) {
                uVar16 = iVar19 - 2;
              }
              uVar8 = 0xffffffff;
              if (uVar17 != 0xffffffff) {
                if (uVar17 * -0x55555555 < 0x55555556) {
                  uVar8 = uVar17 + 2;
                }
                else {
                  uVar8 = uVar17 - 1;
                }
              }
              uVar17 = uVar8;
              IVar18.value_ = 0xffffffff;
              IVar20.value_ = 0xffffffff;
              if (-1 < (int)uVar16) {
                IVar20.value_ =
                     (mesh->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar16 / 3]._M_elems
                     [uVar16 % 3].value_;
              }
              if (-1 < (int)uVar17) {
                IVar18.value_ =
                     (mesh->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar17 / 3]._M_elems
                     [uVar17 % 3].value_;
              }
              if (att->identity_mapping_ == false) {
                pIVar6 = (att->indices_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                IVar20.value_ = pIVar6[IVar20.value_].value_;
                IVar18.value_ = pIVar6[IVar18.value_].value_;
              }
              if (IVar20.value_ != IVar18.value_) {
                this->no_interior_seams_ = false;
                lVar7 = (long)(this->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p;
                puVar1 = (ulong *)(lVar7 + (uVar22 >> 6 & 0x3ffffff) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)uVar22 & 0x3f);
                puVar1 = (ulong *)(lVar7 + (ulong)(uVar11 >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
                uVar17 = uVar13 - 2;
                if (0x55555555 < (uVar13 + 1) * -0x55555555) {
                  uVar17 = uVar13 + 1;
                }
                IVar12.value_ = 0xffffffff;
                if (uVar17 != 0xffffffff) {
                  IVar12.value_ =
                       (this_00->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
                }
                p_Var15 = (this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                p_Var15[IVar12.value_ >> 6] =
                     p_Var15[IVar12.value_ >> 6] | 1L << ((byte)IVar12.value_ & 0x3f);
                if (uVar13 + (int)((uVar22 & 0xffffffff) / 3) * -3 == 0) {
                  uVar13 = uVar13 + 2;
                  IVar12.value_ = 0xffffffff;
                  if (uVar13 != 0xffffffff) goto LAB_001336f4;
                }
                else {
                  uVar13 = uVar13 - 1;
LAB_001336f4:
                  IVar12.value_ =
                       (this_00->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].value_;
                }
                p_Var15[IVar12.value_ >> 6] =
                     p_Var15[IVar12.value_ >> 6] | 1L << ((byte)IVar12.value_ & 0x3f);
                uVar13 = uVar11 - 2;
                if (0x55555555 < (uVar11 + 1) * -0x55555555) {
                  uVar13 = uVar11 + 1;
                }
                IVar12.value_ = 0xffffffff;
                if (uVar13 != 0xffffffff) {
                  IVar12.value_ =
                       (this_00->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].value_;
                }
                p_Var15[IVar12.value_ >> 6] =
                     p_Var15[IVar12.value_ >> 6] | 1L << ((byte)IVar12.value_ & 0x3f);
                if (uVar11 * -0x55555555 < 0x55555556) goto LAB_0013375e;
                uVar11 = uVar11 - 1;
                goto LAB_00133768;
              }
              uVar21 = (ulong)uVar16;
              bVar10 = false;
            } while (bVar14);
          }
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < ((ulong)((long)(this_00->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff))
      ;
    }
    RecomputeVertices(this,mesh,att);
  }
  return bVar9;
}

Assistant:

bool MeshAttributeCornerTable::InitFromAttribute(const Mesh *mesh,
                                                 const CornerTable *table,
                                                 const PointAttribute *att) {
  if (!InitEmpty(table)) {
    return false;
  }
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();

  // Find all necessary data for encoding attributes. For now we check which of
  // the mesh vertices is part of an attribute seam, because seams require
  // special handling.
  for (CornerIndex c(0); c < corner_table_->num_corners(); ++c) {
    const FaceIndex f = corner_table_->Face(c);
    if (corner_table_->IsDegenerated(f)) {
      continue;  // Ignore corners on degenerated faces.
    }
    const CornerIndex opp_corner = corner_table_->Opposite(c);
    if (opp_corner == kInvalidCornerIndex) {
      // Boundary. Mark it as seam edge.
      is_edge_on_seam_[c.value()] = true;
      // Mark seam vertices.
      VertexIndex v;
      v = corner_table_->Vertex(corner_table_->Next(c));
      is_vertex_on_seam_[v.value()] = true;
      v = corner_table_->Vertex(corner_table_->Previous(c));
      is_vertex_on_seam_[v.value()] = true;
      continue;
    }
    if (opp_corner < c) {
      continue;  // Opposite corner was already processed.
    }

    CornerIndex act_c(c), act_sibling_c(opp_corner);
    for (int i = 0; i < 2; ++i) {
      // Get the sibling corners. I.e., the two corners attached to the same
      // vertex but divided by the seam edge.
      act_c = corner_table_->Next(act_c);
      act_sibling_c = corner_table_->Previous(act_sibling_c);
      const PointIndex point_id = mesh->CornerToPointId(act_c.value());
      const PointIndex sibling_point_id =
          mesh->CornerToPointId(act_sibling_c.value());
      if (att->mapped_index(point_id) != att->mapped_index(sibling_point_id)) {
        no_interior_seams_ = false;
        is_edge_on_seam_[c.value()] = true;
        is_edge_on_seam_[opp_corner.value()] = true;
        // Mark seam vertices.
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Next(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_
            [corner_table_->Vertex(corner_table_->Next(opp_corner)).value()] =
                true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(opp_corner))
                               .value()] = true;
        break;
      }
    }
  }
  RecomputeVertices(mesh, att);
  return true;
}